

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void PrintEthernetPhyStatusV3(AmpIO *Board,uint chan)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  ulong local_60;
  size_t i;
  ushort auStack_50 [3];
  uint16_t coreReg;
  unsigned_short speedMap [4];
  char *speedStr [4];
  uint speed;
  uint phyAddr;
  uint16_t reg;
  AmpIO *pAStack_10;
  uint chan_local;
  AmpIO *Board_local;
  
  phyAddr = chan;
  pAStack_10 = Board;
  poVar3 = std::operator<<((ostream *)&std::cout,"PHY");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,phyAddr);
  std::operator<<(poVar3,":");
  bVar1 = FpgaIO::ReadRTL8211F_Register
                    (&pAStack_10->super_FpgaIO,phyAddr,1,0x1a,(uint16_t *)((long)&speed + 2));
  if (bVar1) {
    if ((speed._2_2_ & 4) != 0) {
      std::operator<<((ostream *)&std::cout," link-good");
    }
    if ((speed._2_2_ & 8) == 0) {
      std::operator<<((ostream *)&std::cout," half-duplex");
    }
    else {
      std::operator<<((ostream *)&std::cout," full-duplex");
    }
    uVar2 = (uint)speed._2_2_;
    speedMap = (unsigned_short  [4])((long)" 10Mbps" + 1);
    poVar3 = std::operator<<((ostream *)&std::cout," ");
    std::operator<<(poVar3,speedStr[(ulong)(uint)((int)(uVar2 & 0x30) >> 4) - 1]);
    if ((speed._2_2_ & 2) != 0) {
      std::operator<<((ostream *)&std::cout," polarity-reversed");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    _auStack_50 = 0x2040004020000000;
    std::operator<<((ostream *)&std::cout,"Reading GMII core register: ");
    bVar1 = FpgaIO::ReadRTL8211F_Register
                      (&pAStack_10->super_FpgaIO,phyAddr,8,0x10,(uint16_t *)((long)&i + 6));
    if (bVar1) {
      pvVar4 = (void *)std::ostream::operator<<(&std::cout,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,i._6_2_);
      std::ostream::operator<<(pvVar4,std::dec);
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        if ((i._6_2_ & 0x2040) == *(ushort *)((long)speedStr + local_60 * 2 + -0x10)) {
          poVar3 = std::operator<<((ostream *)&std::cout,", Speed: ");
          std::operator<<(poVar3,speedStr[local_60 - 1]);
          break;
        }
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout," failed to read to GMII core register");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout," failed to read PHYSR");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void PrintEthernetPhyStatusV3(AmpIO &Board, unsigned int chan)
{
    std::cout << "PHY" << chan << ":";
    uint16_t reg;
    unsigned int phyAddr = FpgaIO::PHY_RTL8211F;
    // This should be on page 0xa43, but seems to work fine on default page
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYSR, reg)) {
        std::cout << " failed to read PHYSR" << std::endl;
        return;
    }
    if (reg & 0x0004) std::cout << " link-good";
    if (reg & 0x0008) std::cout << " full-duplex";
    else std::cout << " half-duplex";
    unsigned int speed = (reg & 0x0030)>>4;
    const char *speedStr[4] = { "10Mbps", "100 Mbps", "1000 Mbps", "??" };
    std::cout << " " << speedStr[speed];
    if (reg & 0x0002) std::cout << " polarity-reversed";
    std::cout << std::endl;

    // Speed setting uses bits 6 and 13, as follows:
    //
    //   speed | Mbps | 6,13  | register value
    //     0   |   10 | 0, 0  |     0x0000
    //     1   |  100 | 0, 1  |     0x2000
    //     2   | 1000 | 1, 0  |     0x0040
    //     3   |   ?? | 1, 1  |     0x2040
    unsigned short speedMap[4] = { 0x0000, 0x2000, 0x0040, 0x2040 };
    std::cout << "Reading GMII core register: ";
    uint16_t coreReg;
    if (Board.ReadRTL8211F_Register(chan, FpgaIO::PHY_GMII_CORE, 16, coreReg)) {
        std::cout << std::hex << coreReg << std::dec;
        for (size_t i = 0; i < 4; i++) {
            if ((coreReg&0x2040) == speedMap[i]) {
                std::cout << ", Speed: " << speedStr[i];
                break;
            }
        }
        std::cout << std::endl;
    }
    else {
        std::cout << " failed to read to GMII core register" << std::endl;
    }
}